

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall
soplex::SoPlexBase<double>::_solveRealLPAndRecordStatistics
          (SoPlexBase<double> *this,bool *interrupt)

{
  SPxSolverBase<double> *this_00;
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Settings *pSVar6;
  Tolerances *pTVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  Statistics *pSVar9;
  int iVar10;
  int iVar11;
  Representation p_rep;
  Type tp;
  Verbosity old_verbosity;
  bool bVar12;
  double extraout_XMM0_Qa;
  Real RVar13;
  Real RVar14;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar15;
  
  pSVar6 = this->_currentSettings;
  dVar15 = pSVar6->_realParamValues[6];
  iVar11 = -1;
  if ((double)pSVar6->_intParamValues[5] < dVar15) {
    iVar10 = pSVar6->_intParamValues[5] - this->_statistics->iterations;
    iVar11 = -1;
    if (-1 < iVar10) {
      iVar11 = iVar10;
    }
  }
  bVar12 = this->_hasBasis;
  (this->_solver).maxIters = iVar11;
  dVar1 = pSVar6->_realParamValues[7];
  if (dVar1 < dVar15) {
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    dVar15 = dVar1 - extraout_XMM0_Qa;
  }
  RVar13 = 0.0;
  if (0.0 <= dVar15) {
    RVar13 = dVar15;
  }
  (this->_solver).maxTime = RVar13;
  RVar13 = Tolerances::epsilon((this->_solver).super_SPxLPBase<double>._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  pTVar7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  RVar14 = Tolerances::floatingPointFeastol(pTVar7);
  dVar15 = RVar13 * 10000.0;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  if (RVar14 < dVar15) {
    pTVar7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    Tolerances::setFloatingPointFeastol(pTVar7,dVar15);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
  }
  pTVar7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  RVar13 = Tolerances::floatingPointOpttol(pTVar7);
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  if (RVar13 < dVar15) {
    pTVar7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      }
    }
    Tolerances::setFloatingPointOpttol(pTVar7,dVar15);
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
  }
  this_00 = &this->_solver;
  pSVar6 = this->_currentSettings;
  iVar11 = pSVar6->_intParamValues[1];
  if (iVar11 == 2) {
LAB_003197b1:
    p_rep = ROW;
    if ((this->_solver).theRep == ROW) goto LAB_003197c7;
  }
  else {
    if (iVar11 != 1) {
      if (iVar11 != 0) goto LAB_003197c7;
      if ((double)((this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum + 1) <=
          (double)((this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum + 1) * pSVar6->_realParamValues[0x10])
      goto LAB_0031976e;
LAB_0031977c:
      if ((iVar11 != 2) &&
         ((iVar11 != 0 ||
          ((double)((this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.thenum + 1) <=
           (double)((this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                    super_SVSetBase<double>.set.thenum + 1) * pSVar6->_realParamValues[0x10]))))
      goto LAB_003197c7;
      goto LAB_003197b1;
    }
LAB_0031976e:
    p_rep = COLUMN;
    if ((this->_solver).theRep == COLUMN) goto LAB_0031977c;
  }
  SPxSolverBase<double>::initRep(this_00,p_rep);
LAB_003197c7:
  iVar11 = this->_currentSettings->_intParamValues[2];
  if (((((iVar11 == 0) && ((this->_solver).theRep == COLUMN)) ||
       ((iVar11 == 1 && ((this->_solver).theRep == ROW)))) &&
      (tp = ENTER, (this->_solver).theType != ENTER)) ||
     ((((iVar11 == 1 && ((this->_solver).theRep == COLUMN)) ||
       ((iVar11 == 0 && ((this->_solver).theRep == ROW)))) &&
      (tp = LEAVE, (this->_solver).theType != LEAVE)))) {
    SPxSolverBase<double>::setType(this_00,tp);
  }
  pSVar6 = this->_currentSettings;
  (this->_solver).sparsePricingFactor = pSVar6->_realParamValues[0xf];
  iVar11 = pSVar6->_intParamValues[0x14];
  if (iVar11 == 0) {
    (this->_solver).hyperPricingLeave = false;
    (this->_solver).hyperPricingEnter = false;
  }
  else if ((iVar11 == 2) ||
          ((iVar11 == 1 &&
           (5000 < (this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum +
                   (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum)))) {
    (this->_solver).hyperPricingLeave = true;
    (this->_solver).hyperPricingEnter = true;
    DIdxSet::setMax(&(this->_solver).updateViols,(((this->_solver).thecovectors)->set).thenum);
    DIdxSet::setMax(&(this->_solver).updateViolsCo,(((this->_solver).thevectors)->set).thenum);
  }
  pSVar9 = this->_statistics;
  pSVar6 = this->_currentSettings;
  (this->_solver).super_SPxBasisBase<double>.nonzeroFactor = pSVar6->_realParamValues[0x13];
  (this->_solver).super_SPxBasisBase<double>.fillFactor = pSVar6->_realParamValues[0x14];
  (this->_solver).super_SPxBasisBase<double>.memFactor = pSVar6->_realParamValues[0x15];
  (*pSVar9->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<double>::solve(this_00,interrupt,true);
  (*this->_statistics->simplexTime->_vptr_Timer[4])();
  if ((0 < (this->_solver).super_SPxBasisBase<double>.iterCount) &&
     ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED)) {
    SLUFactorRational::init(&this->_rationalLUSolver,(EVP_PKEY_CTX *)interrupt);
  }
  iVar11 = (this->_solver).super_SPxBasisBase<double>.iterCount;
  pSVar9 = this->_statistics;
  pSVar9->iterations = pSVar9->iterations + iVar11;
  iVar10 = iVar11;
  if (iVar11 != 0) {
    iVar10 = (this->_solver).primalCount;
  }
  pSVar9->iterationsPrimal = pSVar9->iterationsPrimal + iVar10;
  iVar10 = 0;
  if (bVar12 != false) {
    iVar10 = iVar11;
  }
  pSVar9->iterationsFromBasis = pSVar9->iterationsFromBasis + iVar10;
  pSVar9->iterationsPolish = pSVar9->iterationsPolish + (this->_solver).polishCount;
  pSVar9->boundflips = pSVar9->boundflips + (this->_solver).totalboundflips;
  (*((this->_solver).multTimeSparse)->_vptr_Timer[6])();
  this->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + this->_statistics->multTimeSparse;
  (*((this->_solver).multTimeFull)->_vptr_Timer[6])();
  this->_statistics->multTimeFull = extraout_XMM0_Qa_01 + this->_statistics->multTimeFull;
  (*((this->_solver).multTimeColwise)->_vptr_Timer[6])();
  this->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + this->_statistics->multTimeColwise;
  (*((this->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  pSVar9 = this->_statistics;
  pSVar9->multTimeUnsetup = extraout_XMM0_Qa_03 + pSVar9->multTimeUnsetup;
  uVar2 = (this->_solver).multSparseCalls;
  uVar3 = (this->_solver).multFullCalls;
  uVar4 = (this->_solver).multColwiseCalls;
  uVar5 = (this->_solver).multUnsetupCalls;
  pSVar9->multSparseCalls = pSVar9->multSparseCalls + uVar2;
  pSVar9->multFullCalls = pSVar9->multFullCalls + uVar3;
  pSVar9->multColwiseCalls = pSVar9->multColwiseCalls + uVar4;
  pSVar9->multUnsetupCalls = pSVar9->multUnsetupCalls + uVar5;
  (*((this->_slufactor).super_CLUFactor<double>.factorTime)->_vptr_Timer[6])();
  this->_statistics->luFactorizationTimeReal =
       extraout_XMM0_Qa_04 + this->_statistics->luFactorizationTimeReal;
  (*((this->_slufactor).solveTime)->_vptr_Timer[6])();
  pSVar9 = this->_statistics;
  pSVar9->luSolveTimeReal = extraout_XMM0_Qa_05 + pSVar9->luSolveTimeReal;
  pSVar9->luFactorizationsReal =
       pSVar9->luFactorizationsReal + (this->_slufactor).super_CLUFactor<double>.factorCount;
  pSVar9->luSolvesReal = pSVar9->luSolvesReal + (this->_slufactor).solveCount;
  (*((this->_slufactor).super_CLUFactor<double>.factorTime)->_vptr_Timer[2])();
  (*((this->_slufactor).solveTime)->_vptr_Timer[2])();
  (this->_slufactor).super_CLUFactor<double>.factorCount = 0;
  (this->_slufactor).super_CLUFactor<double>.hugeValues = 0;
  (this->_slufactor).solveCount = 0;
  bVar12 = (this->_solver).theRep == ROW;
  pSVar9 = this->_statistics;
  pSVar9->degenPivotsPrimal = pSVar9->degenPivotsPrimal + (&(this->_solver).enterCycles)[bVar12];
  pSVar9->degenPivotsDual = pSVar9->degenPivotsDual + (&(this->_solver).enterCycles)[!bVar12];
  dVar15 = (this->_solver).primalDegenSum;
  pSVar9->sumDualDegen = pSVar9->sumDualDegen + (this->_solver).dualDegenSum;
  pSVar9->sumPrimalDegen = pSVar9->sumPrimalDegen + dVar15;
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}